

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_number.cpp
# Opt level: O3

void __thiscall anon_unknown.dwarf_17380f::JsonNumber::JsonNumber(JsonNumber *this)

{
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__JsonNumber_001bec88;
  testing::StrictMock<mock_json_callbacks>::StrictMock(&this->callbacks_);
  (this->proxy_).original_ = &(this->callbacks_).super_mock_json_callbacks;
  return;
}

Assistant:

JsonNumber ()
                : proxy_{callbacks_} {}